

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamIGA.h
# Opt level: O1

void __thiscall chrono::fea::ChElementBeamIGA::GetSubBlockOffset(ChElementBeamIGA *this)

{
  return;
}

Assistant:

virtual unsigned int GetSubBlockOffset(int nblock) override { return nodes[nblock]->NodeGetOffset_w(); }